

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRoundedCone.h
# Opt level: O2

void __thiscall chrono::geometry::ChRoundedCone::ChRoundedCone(ChRoundedCone *this)

{
  (this->super_ChGeometry)._vptr_ChGeometry = (_func_int **)&PTR__ChGeometry_0118b5b8;
  (this->center).m_data[0] = VNULL;
  (this->center).m_data[1] = DAT_011dd3e0;
  (this->center).m_data[2] = DAT_011dd3e8;
  this->rad = (ChVector<double>)SUB3224(ZEXT832(0) << 0x20,0);
  this->radsphere = (double)SUB328(ZEXT832(0) << 0x20,0x18);
  return;
}

Assistant:

ChRoundedCone(const ChVector<>& mc, const ChVector<>& mrad, double mradsphere)
        : center(mc), rad(mrad), radsphere(mradsphere) {}